

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags.cc
# Opt level: O2

bool gflags::GetCommandLineOption(char *name,string *value)

{
  FlagRegistry *this;
  CommandLineFlag *this_00;
  bool bVar1;
  string sStack_48;
  
  if (name == (char *)0x0) {
    bVar1 = false;
  }
  else {
    if (value == (string *)0x0) {
      __assert_fail("value",
                    "/workspace/llm4binary/github/license_c_cmakelists/jarulraj[P]sqlcheck/external/gflags/src/gflags.cc"
                    ,0x643,"bool gflags::GetCommandLineOption(const char *, string *)");
    }
    this = anon_unknown_2::FlagRegistry::GlobalRegistry();
    gflags_mutex_namespace::Mutex::Lock(&this->lock_);
    this_00 = anon_unknown_2::FlagRegistry::FindFlagLocked(this,name);
    bVar1 = this_00 != (CommandLineFlag *)0x0;
    if (bVar1) {
      (anonymous_namespace)::CommandLineFlag::current_value_abi_cxx11_(&sStack_48,this_00);
      std::__cxx11::string::operator=((string *)value,(string *)&sStack_48);
      std::__cxx11::string::~string((string *)&sStack_48);
    }
    gflags_mutex_namespace::Mutex::Unlock(&this->lock_);
  }
  return bVar1;
}

Assistant:

bool GetCommandLineOption(const char* name, string* value) {
  if (NULL == name)
    return false;
  assert(value);

  FlagRegistry* const registry = FlagRegistry::GlobalRegistry();
  FlagRegistryLock frl(registry);
  CommandLineFlag* flag = registry->FindFlagLocked(name);
  if (flag == NULL) {
    return false;
  } else {
    *value = flag->current_value();
    return true;
  }
}